

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<std::array<double,4ul>,double>
               (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *src,
               vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,double eps)

{
  double *pdVar1;
  uint uVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  pointer paVar5;
  pointer paVar6;
  double dVar7;
  _Hash_node_base *p_Var8;
  pointer puVar9;
  mapped_type *pmVar10;
  __node_base _Var11;
  __hash_code __code;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  size_type __new_size;
  double dVar15;
  double dVar16;
  double dVar17;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<double,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>_>
  vdata;
  uint local_7c;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *local_78;
  double local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0) {
    bVar13 = false;
  }
  else {
    puVar9 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar12 = (long)puVar3 - (long)puVar9 >> 2;
    bVar13 = false;
    if (((long)(src->
               super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(src->
               super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5 == uVar12) && (2 < uVar12)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      if (puVar3 == puVar9) {
        __new_size = 1;
      }
      else {
        uVar12 = 0;
        uVar14 = 0;
        local_78 = dst;
        local_70 = eps;
        do {
          local_7c = puVar9[uVar12];
          if (uVar14 < local_7c) {
            uVar14 = local_7c;
          }
          if (local_68._M_buckets[(ulong)local_7c % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var4 = local_68._M_buckets[(ulong)local_7c % local_68._M_bucket_count]->_M_nxt;
            uVar2 = *(uint *)&p_Var4[1]._M_nxt;
            do {
              if (local_7c == uVar2) {
                pmVar10 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_68,&local_7c);
                paVar5 = (src->
                         super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                dVar7 = ABS(pmVar10->_M_elems[0] - paVar5[uVar12]._M_elems[0]);
                if (local_70 < dVar7) {
                  dVar17 = ABS(pmVar10->_M_elems[0]);
                  dVar15 = ABS(paVar5[uVar12]._M_elems[0]);
                  dVar16 = dVar15;
                  if (dVar15 <= dVar17) {
                    dVar16 = dVar17;
                  }
                  if (dVar7 <= (double)(~-(ulong)NAN(dVar17) & (ulong)dVar16 |
                                       -(ulong)NAN(dVar17) & (ulong)dVar15) * local_70)
                  goto LAB_003796d6;
                }
                else {
LAB_003796d6:
                  dVar7 = ABS(pmVar10->_M_elems[1] - paVar5[uVar12]._M_elems[1]);
                  if (local_70 < dVar7) {
                    dVar17 = ABS(pmVar10->_M_elems[1]);
                    dVar15 = ABS(paVar5[uVar12]._M_elems[1]);
                    dVar16 = dVar15;
                    if (dVar15 <= dVar17) {
                      dVar16 = dVar17;
                    }
                    if ((double)(~-(ulong)NAN(dVar17) & (ulong)dVar16 |
                                -(ulong)NAN(dVar17) & (ulong)dVar15) * local_70 < dVar7)
                    goto LAB_0037989b;
                  }
                  dVar7 = ABS(pmVar10->_M_elems[2] - paVar5[uVar12]._M_elems[2]);
                  if (local_70 < dVar7) {
                    dVar17 = ABS(pmVar10->_M_elems[2]);
                    dVar15 = ABS(paVar5[uVar12]._M_elems[2]);
                    dVar16 = dVar15;
                    if (dVar15 <= dVar17) {
                      dVar16 = dVar17;
                    }
                    if ((double)(~-(ulong)NAN(dVar17) & (ulong)dVar16 |
                                -(ulong)NAN(dVar17) & (ulong)dVar15) * local_70 < dVar7)
                    goto LAB_0037989b;
                  }
                  dVar7 = ABS(pmVar10->_M_elems[3] - paVar5[uVar12]._M_elems[3]);
                  if (dVar7 <= local_70) goto LAB_00379822;
                  dVar17 = ABS(pmVar10->_M_elems[3]);
                  dVar15 = ABS(paVar5[uVar12]._M_elems[3]);
                  dVar16 = dVar15;
                  if (dVar15 <= dVar17) {
                    dVar16 = dVar17;
                  }
                  if (dVar7 <= (double)(~-(ulong)NAN(dVar17) & (ulong)dVar16 |
                                       -(ulong)NAN(dVar17) & (ulong)dVar15) * local_70)
                  goto LAB_00379822;
                }
LAB_0037989b:
                bVar13 = false;
                goto LAB_0037989d;
              }
              p_Var4 = p_Var4->_M_nxt;
            } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                    (uVar2 = *(uint *)&p_Var4[1]._M_nxt,
                    (ulong)uVar2 % local_68._M_bucket_count ==
                    (ulong)local_7c % local_68._M_bucket_count));
          }
          paVar6 = (src->
                   super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_68,&local_7c);
          paVar5 = paVar6 + uVar12;
          dVar7 = paVar5->_M_elems[1];
          pdVar1 = paVar6[uVar12]._M_elems + 2;
          dVar16 = *pdVar1;
          dVar15 = pdVar1[1];
          pmVar10->_M_elems[0] = paVar5->_M_elems[0];
          pmVar10->_M_elems[1] = dVar7;
          pmVar10->_M_elems[2] = dVar16;
          pmVar10->_M_elems[3] = dVar15;
LAB_00379822:
          uVar12 = uVar12 + 1;
          puVar9 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)(faceVertexIndices->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar9
                                 >> 2));
        __new_size = (size_type)(uVar14 + 1);
        dst = local_78;
      }
      ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
                (dst,__new_size);
      memset((dst->
             super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_start,0,__new_size << 5);
      bVar13 = true;
      for (_Var11._M_nxt = local_68._M_before_begin._M_nxt; _Var11._M_nxt != (_Hash_node_base *)0x0;
          _Var11._M_nxt = (_Var11._M_nxt)->_M_nxt) {
        uVar14 = *(uint *)&_Var11._M_nxt[1]._M_nxt;
        paVar5 = (dst->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = _Var11._M_nxt[5]._M_nxt;
        pdVar1 = paVar5[uVar14]._M_elems + 2;
        *pdVar1 = (double)_Var11._M_nxt[4]._M_nxt;
        pdVar1[1] = (double)p_Var8;
        p_Var8 = _Var11._M_nxt[3]._M_nxt;
        paVar5 = paVar5 + uVar14;
        paVar5->_M_elems[0] = (double)_Var11._M_nxt[2]._M_nxt;
        paVar5->_M_elems[1] = (double)p_Var8;
      }
LAB_0037989d:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar13;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}